

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                   t_float basey,int vis)

{
  int iVar1;
  int iVar2;
  int zoom;
  _glist *p_Var3;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  char local_518 [4];
  int color;
  char buf [1024];
  int yloc;
  int xloc;
  t_atom at;
  t_atom fontatoms [3];
  char *tags [2];
  char tag [80];
  t_drawnumber *x;
  int vis_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  fontatoms[2].a_w.w_symbol = (t_symbol *)(tags + 1);
  tags[0] = "label";
  if (vis != 0) {
    tVar4 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
    if ((tVar4 == 0.0) && (!NAN(tVar4))) {
      return;
    }
  }
  sprintf((char *)(tags + 1),"drawnumber%lx",data);
  if (vis == 0) {
    p_Var3 = glist_getcanvas(glist);
    pdgui_vmess((char *)0x0,"crs",p_Var3,"delete",tags + 1);
  }
  else {
    tVar4 = fielddesc_getcoord((_fielddesc *)&z[3].g_next,template,data,0);
    tVar4 = glist_xtopixels(glist,basex + tVar4);
    tVar5 = fielddesc_getcoord((_fielddesc *)(z + 6),template,data,0);
    tVar5 = glist_ytopixels(glist,basey + tVar5);
    tVar6 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
    iVar1 = numbertocolor((int)tVar6);
    drawnumber_getbuf((t_drawnumber *)z,data,template,local_518);
    at.a_w.w_float = 2.8026e-45;
    fontatoms[0]._0_8_ = gensym(sys_font);
    fontatoms[0].a_w.w_float = 1.4013e-45;
    iVar2 = glist_getfont(glist);
    zoom = glist_getzoom(glist);
    iVar2 = sys_hostfontsize(iVar2,zoom);
    fontatoms[1].a_type = (t_atomtype)(float)-iVar2;
    fontatoms[1].a_w.w_float = 2.8026e-45;
    fontatoms[2]._0_8_ = gensym(sys_fontweight);
    p_Var3 = glist_getcanvas(glist);
    pdgui_vmess((char *)0x0,"crr ii rs rk rs rA rS",p_Var3,"create","text",(ulong)(uint)(int)tVar4,
                (int)tVar5,"-anchor","nw","-fill",iVar1,"-text",local_518,"-font",3,&at.a_w,"-tags",
                2,&fontatoms[2].a_w);
  }
  return;
}

Assistant:

static void drawnumber_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_drawnumber *x = (t_drawnumber *)z;
    char tag[80];
    const char*tags[] = {tag, "label"};

        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag, "drawnumber%lx", data);
    if (vis)
    {
        t_atom fontatoms[3];
        t_atom at;
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(&x->x_xloc, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(&x->x_yloc, template, data, 0));
        char buf[DRAWNUMBER_BUFSIZE];
        int color = numbertocolor(
            fielddesc_getfloat(&x->x_color, template, data, 1));
        drawnumber_getbuf(x, data, template, buf);

        SETSYMBOL(fontatoms+0, gensym(sys_font));
        SETFLOAT (fontatoms+1,-sys_hostfontsize(glist_getfont(glist), glist_getzoom(glist)));
        SETSYMBOL(fontatoms+2, gensym(sys_fontweight));
        pdgui_vmess(0, "crr ii rs rk rs rA rS",
            glist_getcanvas(glist), "create", "text",
            xloc, yloc,
            "-anchor", "nw",
            "-fill", color,
            "-text", buf,
            "-font", 3, fontatoms,
            "-tags", 2, tags);
    }
    else
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
}